

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr_conflict pxVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  xmlRelaxNGDefinePtr *ppxVar5;
  
  iVar3 = -1;
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return -1;
  }
  uVar4 = def->dflags;
  if (def->type == XML_RELAXNG_ELEMENT) {
    if ((uVar4 & 0xc0) == 0) {
      ppxVar5 = &def->content;
      iVar3 = -1;
      do {
        iVar2 = iVar3;
        pxVar1 = *ppxVar5;
        if (pxVar1 == (xmlRelaxNGDefinePtr_conflict)0x0) break;
        iVar2 = xmlRelaxNGIsCompilable(pxVar1);
        ppxVar5 = &pxVar1->next;
        iVar3 = 1;
      } while (iVar2 == 1);
      if (iVar2 == 1) {
        uVar4 = (ushort)(byte)((byte)def->dflags >> 7) * 0x40 + 0x40;
      }
      else {
        if (iVar2 != 0) goto LAB_001803d3;
        uVar4 = def->dflags & 0xff3fU | 0x80;
      }
      def->dflags = uVar4;
    }
LAB_001803d3:
    if (def->nameClass != (xmlRelaxNGDefinePtr)0x0) {
      return 0;
    }
    return (uint)(def->name != (xmlChar *)0x0);
  }
  if ((uVar4 & 0x40) == 0) {
    if (-1 < (char)uVar4) {
      switch(def->type) {
      case XML_RELAXNG_EMPTY:
      case XML_RELAXNG_TEXT:
        goto switchD_0018037b_caseD_0;
      case XML_RELAXNG_NOT_ALLOWED:
      case XML_RELAXNG_EXCEPT:
      case XML_RELAXNG_DATATYPE:
      case XML_RELAXNG_PARAM:
      case XML_RELAXNG_VALUE:
      case XML_RELAXNG_LIST:
      case XML_RELAXNG_ATTRIBUTE:
      case XML_RELAXNG_INTERLEAVE:
        goto switchD_0018037b_caseD_1;
      default:
        goto switchD_0018037b_caseD_4;
      case XML_RELAXNG_DEF:
      case XML_RELAXNG_OPTIONAL:
      case XML_RELAXNG_ZEROORMORE:
      case XML_RELAXNG_ONEORMORE:
      case XML_RELAXNG_CHOICE:
      case XML_RELAXNG_GROUP:
      case XML_RELAXNG_START:
        ppxVar5 = &def->content;
        iVar3 = -1;
        do {
          iVar2 = iVar3;
          pxVar1 = *ppxVar5;
          if (pxVar1 == (xmlRelaxNGDefinePtr_conflict)0x0) break;
          iVar2 = xmlRelaxNGIsCompilable(pxVar1);
          ppxVar5 = &pxVar1->next;
          iVar3 = 1;
        } while (iVar2 == 1);
        break;
      case XML_RELAXNG_REF:
      case XML_RELAXNG_EXTERNALREF:
      case XML_RELAXNG_PARENTREF:
        if (def->depth == -0x14) goto LAB_001803fc;
        def->depth = -0x14;
        ppxVar5 = &def->content;
        iVar3 = -1;
        do {
          iVar2 = iVar3;
          pxVar1 = *ppxVar5;
          if (pxVar1 == (xmlRelaxNGDefinePtr_conflict)0x0) break;
          iVar2 = xmlRelaxNGIsCompilable(pxVar1);
          ppxVar5 = &pxVar1->next;
          iVar3 = 1;
        } while (iVar2 == 1);
        break;
      case XML_RELAXNG_NOOP:
        iVar2 = xmlRelaxNGIsCompilable(def->content);
      }
      if (iVar2 == 1) {
        uVar4 = def->dflags;
switchD_0018037b_caseD_0:
        def->dflags = uVar4 | 0x40;
        goto LAB_001803fc;
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      uVar4 = def->dflags;
switchD_0018037b_caseD_1:
      def->dflags = uVar4 | 0x80;
    }
    iVar3 = 0;
  }
  else {
LAB_001803fc:
    iVar3 = 1;
  }
switchD_0018037b_caseD_4:
  return iVar3;
}

Assistant:

static int
xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr def)
{
    int ret = -1;

    if (def == NULL) {
        return (-1);
    }
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_COMPILABLE))
        return (1);
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_NOT_COMPILABLE))
        return (0);
    switch (def->type) {
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGIsCompilable(def->content);
            break;
        case XML_RELAXNG_TEXT:
        case XML_RELAXNG_EMPTY:
            ret = 1;
            break;
        case XML_RELAXNG_ELEMENT:
            /*
             * Check if the element content is compilable
             */
            if (((def->dflags & IS_NOT_COMPILABLE) == 0) &&
                ((def->dflags & IS_COMPILABLE) == 0)) {
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
		/*
		 * Because the routine is recursive, we must guard against
		 * discovering both COMPILABLE and NOT_COMPILABLE
		 */
                if (ret == 0) {
		    def->dflags &= ~IS_COMPILABLE;
                    def->dflags |= IS_NOT_COMPILABLE;
		}
                if ((ret == 1) && !(def->dflags &= IS_NOT_COMPILABLE))
                    def->dflags |= IS_COMPILABLE;
            }
            /*
             * All elements return a compilable status unless they
             * are generic like anyName
             */
            if ((def->nameClass != NULL) || (def->name == NULL))
                ret = 0;
            else
                ret = 1;
            return (ret);
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
            if (def->depth == -20) {
                return (1);
            } else {
                xmlRelaxNGDefinePtr list;

                def->depth = -20;
                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
            }
            break;
        case XML_RELAXNG_START:
        case XML_RELAXNG_OPTIONAL:
        case XML_RELAXNG_ZEROORMORE:
        case XML_RELAXNG_ONEORMORE:
        case XML_RELAXNG_CHOICE:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:{
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_NOT_ALLOWED:
            ret = 0;
            break;
    }
    if (ret == 0)
        def->dflags |= IS_NOT_COMPILABLE;
    if (ret == 1)
        def->dflags |= IS_COMPILABLE;
    return (ret);
}